

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O2

AmsResponse * __thiscall
AmsConnection::Write(AmsConnection *this,AmsRequest *request,AmsAddr srcAddr)

{
  uint16_t uVar1;
  uint16_t uVar2;
  AmsAddr *pAVar3;
  size_t sVar4;
  size_t sVar5;
  AmsResponse *pAVar6;
  void *__buf;
  AmsTcpHeader header;
  AoEHeader aoeHeader;
  AmsTcpHeader local_56;
  AoEHeader local_50;
  
  pAVar3 = request->destAddr;
  uVar1 = pAVar3->port;
  uVar2 = request->cmdId;
  sVar4 = Frame::size(&request->frame);
  local_50.leInvokeId = GetInvokeId(this);
  local_50.targetNetId.b._0_4_ = *(undefined4 *)(pAVar3->netId).b;
  local_50.targetNetId.b._4_2_ = *(undefined2 *)((pAVar3->netId).b + 4);
  local_50.sourceNetId.b._4_2_ = srcAddr.netId.b._4_2_;
  local_50.sourceNetId.b._0_4_ = srcAddr.netId.b._0_4_;
  local_50.leStateFlags = 4;
  local_50.leLength = (uint32_t)sVar4;
  local_50.leErrorCode = 0;
  local_50.leTargetPort = uVar1;
  local_50.leSourcePort = srcAddr.port;
  local_50.leCmdId = uVar2;
  Frame::prepend<AoEHeader>(&request->frame,&local_50);
  sVar5 = Frame::size(&request->frame);
  local_56.reserved = 0;
  local_56.leLength = (uint32_t)sVar5;
  Frame::prepend<AmsTcpHeader>(&request->frame,&local_56);
  pAVar6 = Reserve(this,request,srcAddr.port);
  if (pAVar6 != (AmsResponse *)0x0) {
    LOCK();
    (pAVar6->invokeId).super___atomic_base<unsigned_int>._M_i = local_50.leInvokeId;
    UNLOCK();
    sVar5 = Frame::size(&request->frame);
    sVar4 = Socket::write(&(this->socket).super_Socket,(int)request,__buf,sVar4);
    if (sVar5 == sVar4) {
      return pAVar6;
    }
    pAVar6->errorCode = 0xffffffff;
    LOCK();
    (pAVar6->request)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  return (AmsResponse *)0x0;
}

Assistant:

AmsResponse* AmsConnection::Write(AmsRequest& request, const AmsAddr srcAddr)
{
    const AoEHeader aoeHeader {
        request.destAddr.netId, request.destAddr.port,
        srcAddr.netId, srcAddr.port,
        request.cmdId,
        static_cast<uint32_t>(request.frame.size()),
        GetInvokeId()
    };
    request.frame.prepend<AoEHeader>(aoeHeader);

    const AmsTcpHeader header { static_cast<uint32_t>(request.frame.size()) };
    request.frame.prepend<AmsTcpHeader>(header);

    auto response = Reserve(&request, srcAddr.port);

    if (!response) {
        return nullptr;
    }

    response->invokeId.store(aoeHeader.invokeId());
    if (request.frame.size() != socket.write(request.frame)) {
        response->Release();
        return nullptr;
    }
    return response;
}